

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::AsyncInputStream> * __thiscall
kj::Own<kj::AsyncInputStream>::operator=
          (Own<kj::AsyncInputStream> *this,Own<kj::AsyncInputStream> *other)

{
  Disposer *this_00;
  AsyncInputStream *object;
  AsyncInputStream *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::AsyncInputStream> *other_local;
  Own<kj::AsyncInputStream> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (AsyncInputStream *)0x0;
  if (object != (AsyncInputStream *)0x0) {
    Disposer::dispose<kj::AsyncInputStream>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }